

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall xercesc_4_0::TraverseSchema::traverseImport(TraverseSchema *this,DOMElement *elem)

{
  SchemaInfo *toRestore;
  SchemaInfo *toRestore_00;
  DOMElement *schemaRoot;
  SchemaInfo *saveInfo;
  SchemaInfo *importInfo;
  NamespaceScopeManager nsMgr;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  nsMgr.fSchemaInfo = (SchemaInfo *)elem;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)&importInfo,elem,this->fSchemaInfo,this);
  toRestore_00 = RefHashTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::PtrHasher>::get
                           (this->fPreprocessedNodes,nsMgr.fSchemaInfo);
  if (toRestore_00 != (SchemaInfo *)0x0) {
    toRestore = this->fSchemaInfo;
    restoreSchemaInfo(this,toRestore_00,IMPORT,0xfffffffe);
    schemaRoot = SchemaInfo::getRoot(toRestore_00);
    doTraverseSchema(this,schemaRoot);
    restoreSchemaInfo(this,toRestore,IMPORT,0xfffffffe);
  }
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)&importInfo);
  return;
}

Assistant:

void TraverseSchema::traverseImport(const DOMElement* const elem) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    SchemaInfo* importInfo = fPreprocessedNodes->get(elem);

    if (importInfo) {

        // --------------------------------------------------------
        // Traverse new schema
        // --------------------------------------------------------
        SchemaInfo* saveInfo = fSchemaInfo;

        restoreSchemaInfo(importInfo, SchemaInfo::IMPORT);
        doTraverseSchema(importInfo->getRoot());

        // --------------------------------------------------------
        // Restore old schema information
        // --------------------------------------------------------
        restoreSchemaInfo(saveInfo, SchemaInfo::IMPORT);
    }
}